

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16a64::AckermannTask::provideValue
          (AckermannTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *value)

{
  TaskInterface ti_local;
  int local_38;
  int local_34;
  KeyType local_30;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  if (inputID == 1) {
    AckermannValue::AckermannValue((AckermannValue *)&local_30,value);
    (this->recursiveResultB).value = (int)local_30.key._M_dataplus._M_p;
  }
  else {
    if (inputID != 0) {
      __assert_fail("inputID == 1 && \"invalid input ID\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xa8,
                    "virtual void (anonymous namespace)::AckermannTask::provideValue(core::TaskInterface, uintptr_t, const core::KeyType &, const core::ValueType &)"
                   );
    }
    AckermannValue::AckermannValue((AckermannValue *)&local_30,value);
    (this->recursiveResultA).value = (int)local_30.key._M_dataplus._M_p;
    if ((this->m != 0) && (this->n != 0)) {
      local_38 = this->m + -1;
      local_34 = (int)local_30.key._M_dataplus._M_p;
      (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
                (&local_30,(AckermannKey *)&local_38);
      llbuild::core::TaskInterface::request(&ti_local,&local_30,1);
      std::__cxx11::string::_M_dispose();
    }
  }
  return;
}

Assistant:

virtual void provideValue(core::TaskInterface ti, uintptr_t inputID,
                            const core::KeyType& key, const core::ValueType& value) override {
    if (inputID == 0) {
      recursiveResultA = value;

      // Request the second recursive result, if needed.
      if (m != 0 && n != 0) {
        ti.request(AckermannKey(m-1, recursiveResultA), 1);
      }
    } else {
      assert(inputID == 1 && "invalid input ID");
      recursiveResultB = value;
    }
  }